

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeFromFrequencies
               (HuffmanTree *tree,uint *frequencies,size_t mincodes,size_t numcodes,uint maxbitlen)

{
  void *pvVar1;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  uint error;
  size_t i;
  undefined4 in_stack_00000018;
  size_t in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  uint uVar2;
  undefined8 local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined4 local_4;
  
  local_28 = in_RCX;
  while( true ) {
    uVar2 = in_stack_ffffffffffffffc0 & 0xffffff;
    if (*(int *)(in_RSI + (local_28 - 1) * 4) == 0) {
      uVar2 = CONCAT13(in_RDX < local_28,(int3)in_stack_ffffffffffffffc0);
    }
    if ((char)(uVar2 >> 0x18) == '\0') break;
    local_28 = local_28 - 1;
    in_stack_ffffffffffffffc0 = uVar2;
  }
  *(undefined4 *)(in_RDI + 0x10) = in_R8D;
  *(int *)(in_RDI + 0x14) = (int)local_28;
  pvVar1 = lodepng_realloc((void *)(ulong)uVar2,in_stack_ffffffffffffffb8);
  *(void **)(in_RDI + 8) = pvVar1;
  if (*(long *)(in_RDI + 8) == 0) {
    local_4 = 0x53;
  }
  else {
    for (local_38 = 0; local_38 < local_28; local_38 = local_38 + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 8) + local_38 * 4) = 0;
    }
    local_4 = lodepng_huffman_code_lengths
                        ((uint *)mincodes,(uint *)numcodes,CONCAT44(maxbitlen,in_stack_00000018),
                         i._4_4_);
    if (local_4 == 0) {
      local_4 = HuffmanTree_makeFromLengths2
                          ((HuffmanTree *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
    }
  }
  return local_4;
}

Assistant:

static unsigned HuffmanTree_makeFromFrequencies(HuffmanTree* tree, const unsigned* frequencies,
                                                size_t mincodes, size_t numcodes, unsigned maxbitlen) {
  size_t i;
  unsigned error = 0;
  while(!frequencies[numcodes - 1] && numcodes > mincodes) --numcodes; /*trim zeroes*/
  tree->maxbitlen = maxbitlen;
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/
  tree->lengths = (unsigned*)lodepng_realloc(tree->lengths, numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  /*initialize all lengths to 0*/
  for(i = 0; i < numcodes; i++) tree->lengths[i] = 0;

  error = lodepng_huffman_code_lengths(tree->lengths, frequencies, numcodes, maxbitlen);
  if(!error) error = HuffmanTree_makeFromLengths2(tree);
  return error;
}